

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_short,unsigned_long,12>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_short *lhs,unsigned_long *rhs,unsigned_long *result)

{
  unsigned_long *in_RDX;
  ulong *in_RSI;
  ushort *in_RDI;
  unsigned_short tmp;
  
  if (*in_RSI <= (ulong)*in_RDI) {
    SafeCastHelper<unsigned_long,unsigned_short,0>::
    CastThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (*in_RDI - (short)*in_RSI,in_RDX);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, U& result ) SAFEINT_CPP_THROW
    {
        // both are unsigned - easy case
        if( rhs <= lhs )
        {
            T tmp = (T)(lhs - rhs);
            SafeCastHelper< U, T, GetCastMethod<U, T>::method >::template CastThrow<E>( tmp, result);
            return;
        }

        E::SafeIntOnOverflow();
    }